

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O2

idx_t __thiscall duckdb::FilterCombiner::GetEquivalenceSet(FilterCombiner *this,Expression *expr)

{
  Expression *pEVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
  *this_00;
  idx_t index;
  Expression *local_70;
  vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
  local_68;
  pair<unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>
  local_50;
  
  local_50.first = (unsigned_long)expr;
  iVar2 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->equivalence_set_map)._M_h,(key_type *)&local_50);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    pEVar1 = (Expression *)this->set_index;
    this->set_index = (idx_t)((long)&(pEVar1->super_BaseExpression)._vptr_BaseExpression + 1);
    local_70 = pEVar1;
    local_50.first = (unsigned_long)expr;
    pmVar3 = ::std::__detail::
             _Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->equivalence_set_map,(key_type *)&local_50);
    *pmVar3 = (mapped_type)pEVar1;
    this_00 = (vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
               *)::std::
                 map<unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
                 ::operator[](&this->equivalence_map,(key_type *)&local_70);
    local_50.first = (unsigned_long)expr;
    ::std::
    vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
    ::emplace_back<std::reference_wrapper<duckdb::Expression>>
              (this_00,(reference_wrapper<duckdb::Expression> *)&local_50);
    local_50.first = (unsigned_long)local_70;
    local_50.second.
    super_vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
    .
    super__Vector_base<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.second.
    super_vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
    .
    super__Vector_base<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.second.
    super_vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
    .
    super__Vector_base<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,true>>>>
    ::
    _M_emplace_unique<std::pair<unsigned_long,duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,true>>>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,true>>>>
                *)&this->constant_values,&local_50);
    ::std::
    vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
    ::~vector(&local_50.second.
               super_vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
             );
    ::std::
    vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
    ::~vector(&local_68);
  }
  else {
    local_70 = *(Expression **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_true>
                       ._M_cur + 0x10);
  }
  return (idx_t)local_70;
}

Assistant:

idx_t FilterCombiner::GetEquivalenceSet(Expression &expr) {
	D_ASSERT(stored_expressions.find(expr) != stored_expressions.end());
	D_ASSERT(stored_expressions.find(expr)->second.get() == &expr);
	auto entry = equivalence_set_map.find(expr);
	if (entry == equivalence_set_map.end()) {
		idx_t index = set_index++;
		equivalence_set_map[expr] = index;
		equivalence_map[index].push_back(expr);
		constant_values.insert(make_pair(index, vector<ExpressionValueInformation>()));
		return index;
	} else {
		return entry->second;
	}
}